

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_of(StringPiece *this,StringPiece s,size_type pos)

{
  size_type sVar1;
  stringpiece_ssize_type sVar2;
  long lVar3;
  long lVar4;
  stringpiece_ssize_type i;
  stringpiece_ssize_type length;
  char *data;
  bool lookup [256];
  char acStack_128 [256];
  
  lVar4 = s.length_;
  sVar1 = this->length_;
  if (0 < lVar4 && 0 < (long)sVar1) {
    if (lVar4 == 1) {
      sVar2 = find(this,*s.ptr_,pos);
      return sVar2;
    }
    memset(acStack_128,0,0x100);
    if (0 < lVar4) {
      lVar3 = 0;
      do {
        acStack_128[(byte)s.ptr_[lVar3]] = '\x01';
        lVar3 = lVar3 + 1;
      } while (lVar4 != lVar3);
    }
    if ((long)pos < (long)sVar1) {
      do {
        if (acStack_128[(byte)this->ptr_[pos]] != '\0') {
          return pos;
        }
        pos = pos + 1;
      } while (sVar1 != pos);
    }
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_of(StringPiece s,
                                                  size_type pos) const {
  if (length_ <= 0 || s.length_ <= 0) {
    return npos;
  }
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_first_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i = pos; i < length_; ++i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}